

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_file.cpp
# Opt level: O0

void Omega_h::binary::read_array<double>
               (istream *stream,Read<double> *array,bool is_compressed,bool needs_swapping)

{
  Read<double> *pRVar1;
  double *pdVar2;
  undefined7 in_register_00000009;
  Bytef *__n;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *__buf;
  Write<double> local_d0;
  Read<double> local_c0;
  Read<double> local_b0;
  int local_9c;
  double *pdStack_98;
  int ret;
  Bytef *uncompressed_ptr;
  uLong source_bytes;
  uLong dest_bytes;
  Bytef *compressed;
  I64 compressed_bytes;
  allocator local_59;
  string local_58 [32];
  undefined1 local_38 [8];
  HostWrite<double> uncompressed;
  I64 uncompressed_bytes;
  LO size;
  bool needs_swapping_local;
  bool is_compressed_local;
  Read<double> *array_local;
  istream *stream_local;
  
  __n = (Bytef *)(CONCAT71(in_register_00000009,is_compressed) & 0xffffffffffffff01);
  uncompressed_bytes._7_1_ = (byte)__n;
  uncompressed_bytes._6_1_ = needs_swapping;
  _size = array;
  array_local = (Read<double> *)stream;
  read_value<int>(stream,(int *)&uncompressed_bytes,needs_swapping);
  if ((int)uncompressed_bytes < 0) {
    fail("assertion %s failed at %s +%d\n","size >= 0",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_file.cpp"
         ,0x9b);
  }
  uncompressed.write_.shared_alloc_.direct_ptr = (void *)((long)(int)uncompressed_bytes << 3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"",&local_59);
  HostWrite<double>::HostWrite
            ((HostWrite<double> *)local_38,(int)uncompressed_bytes,(string *)local_58);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  pRVar1 = array_local;
  if ((uncompressed_bytes._7_1_ & 1) == 0) {
    pdVar2 = HostWrite<double>::data((HostWrite<double> *)local_38);
    pdVar2 = nonnull<double>(pdVar2);
    std::istream::read((char *)pRVar1,(long)pdVar2);
    __buf = extraout_RDX_01;
  }
  else {
    read_value<long>((istream *)array_local,(long *)&compressed,(bool)(uncompressed_bytes._6_1_ & 1)
                    );
    if ((long)compressed < 0) {
      fail("assertion %s failed at %s +%d\n","compressed_bytes >= 0",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_file.cpp"
           ,0xa3);
    }
    dest_bytes = (uLong)operator_new__((ulong)compressed);
    std::istream::read((char *)array_local,dest_bytes);
    source_bytes = (uLong)uncompressed.write_.shared_alloc_.direct_ptr;
    uncompressed_ptr = compressed;
    pdVar2 = HostWrite<double>::data((HostWrite<double> *)local_38);
    pdStack_98 = nonnull<double>(pdVar2);
    __n = uncompressed_ptr;
    local_9c = uncompress(pdStack_98,&source_bytes,dest_bytes);
    if (local_9c != 0) {
      fail("assertion %s failed at %s +%d\n","ret == Z_OK",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_file.cpp"
           ,0xac);
    }
    if ((void *)source_bytes != uncompressed.write_.shared_alloc_.direct_ptr) {
      fail("assertion %s failed at %s +%d\n","dest_bytes == static_cast<uLong>(uncompressed_bytes)",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_file.cpp"
           ,0xad);
    }
    __buf = extraout_RDX;
    if (dest_bytes != 0) {
      operator_delete__((void *)dest_bytes);
      __buf = extraout_RDX_00;
    }
  }
  HostWrite<double>::write((HostWrite<double> *)&local_d0,(int)local_38,__buf,(size_t)__n);
  Read<double>::Read(&local_c0,&local_d0);
  swap_bytes<double>((binary *)&local_b0,&local_c0,(bool)(uncompressed_bytes._6_1_ & 1));
  Read<double>::operator=(_size,&local_b0);
  Read<double>::~Read(&local_b0);
  Read<double>::~Read(&local_c0);
  Write<double>::~Write(&local_d0);
  HostWrite<double>::~HostWrite((HostWrite<double> *)local_38);
  return;
}

Assistant:

void read_array(std::istream& stream, Read<T>& array, bool is_compressed,
    bool needs_swapping) {
  LO size;
  read_value(stream, size, needs_swapping);
  OMEGA_H_CHECK(size >= 0);
  I64 uncompressed_bytes =
      static_cast<I64>(static_cast<std::size_t>(size) * sizeof(T));
  HostWrite<T> uncompressed(size);
#ifdef OMEGA_H_USE_ZLIB
  if (is_compressed) {
    I64 compressed_bytes;
    read_value(stream, compressed_bytes, needs_swapping);
    OMEGA_H_CHECK(compressed_bytes >= 0);
    auto compressed = new ::Bytef[compressed_bytes];
    stream.read(reinterpret_cast<char*>(compressed), compressed_bytes);
    uLong dest_bytes = static_cast<uLong>(uncompressed_bytes);
    uLong source_bytes = static_cast<uLong>(compressed_bytes);
    ::Bytef* uncompressed_ptr =
        reinterpret_cast< ::Bytef*>(nonnull(uncompressed.data()));
    int ret =
        ::uncompress(uncompressed_ptr, &dest_bytes, compressed, source_bytes);
    OMEGA_H_CHECK(ret == Z_OK);
    OMEGA_H_CHECK(dest_bytes == static_cast<uLong>(uncompressed_bytes));
    delete[] compressed;
  } else
#else
  OMEGA_H_CHECK(is_compressed == false);
#endif
  {
    stream.read(reinterpret_cast<char*>(nonnull(uncompressed.data())),
        uncompressed_bytes);
  }
  array = swap_bytes(Read<T>(uncompressed.write()), needs_swapping);
}